

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.cpp
# Opt level: O1

int Timidity::update_vibrato(float output_rate,Voice *vp,int sign)

{
  float fVar1;
  float fVar2;
  Sample *pSVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  
  iVar4 = 0;
  if (vp->vibrato_phase < 0x3f) {
    iVar4 = vp->vibrato_phase + 1;
  }
  vp->vibrato_phase = iVar4;
  if (iVar4 < 0x10) {
    iVar5 = 0xf;
  }
  else {
    if (iVar4 < 0x30) {
      iVar5 = iVar4 + -0x10;
      goto LAB_0032b107;
    }
    iVar5 = 0x4f;
  }
  iVar5 = iVar5 - iVar4;
LAB_0032b107:
  iVar7 = vp->vibrato_sample_increment[iVar5];
  if (iVar7 == 0) {
    pSVar3 = vp->sample;
    iVar7 = (uint)pSVar3->vibrato_depth * 0x80;
    if (vp->vibrato_sweep != 0) {
      iVar6 = vp->vibrato_sweep + vp->vibrato_sweep_position;
      vp->vibrato_sweep_position = iVar6;
      if (iVar6 < 0x10000) {
        iVar7 = iVar6 * iVar7 >> 0x10;
      }
      else {
        vp->vibrato_sweep = 0;
      }
    }
    iVar6 = pSVar3->sample_rate;
    fVar1 = vp->frequency;
    fVar2 = pSVar3->root_freq;
    dVar8 = sin((double)iVar4 * 9.587379924285257e-05);
    dVar8 = exp2(dVar8 * 1.0172526041666666e-05 * (double)iVar7);
    dVar8 = ((double)iVar6 * 4096.0 * (double)fVar1 * dVar8) / ((double)output_rate * (double)fVar2)
    ;
    if (vp->vibrato_sweep == 0) {
      vp->vibrato_sample_increment[iVar5] = (int)dVar8;
    }
    if (sign != 0) {
      dVar8 = -dVar8;
    }
    iVar4 = (int)dVar8;
  }
  else {
    iVar4 = -iVar7;
    if (sign == 0) {
      iVar4 = iVar7;
    }
  }
  return iVar4;
}

Assistant:

static int update_vibrato(float output_rate, Voice *vp, int sign)
{
	int depth;
	int phase;
	double a, pb;

	if (vp->vibrato_phase++ >= 2 * VIBRATO_SAMPLE_INCREMENTS - 1)
		vp->vibrato_phase = 0;
	phase = vib_phase_to_inc_ptr(vp->vibrato_phase);

	if (vp->vibrato_sample_increment[phase])
	{
		if (sign)
			return -vp->vibrato_sample_increment[phase];
		else
			return vp->vibrato_sample_increment[phase];
	}

	/* Need to compute this sample increment. */
	depth = vp->sample->vibrato_depth << 7;

	if (vp->vibrato_sweep != 0)
	{
		/* Need to update sweep */
		vp->vibrato_sweep_position += vp->vibrato_sweep;
		if (vp->vibrato_sweep_position >= (1<<SWEEP_SHIFT))
			vp->vibrato_sweep=0;
		else
		{
			/* Adjust depth */
			depth *= vp->vibrato_sweep_position;
			depth >>= SWEEP_SHIFT;
		}
	}

	a = FSCALE(((double)(vp->sample->sample_rate) * vp->frequency) /
		((double)(vp->sample->root_freq) * output_rate),
		FRACTION_BITS);

	pb = (sine(vp->vibrato_phase * (1.0/(2*VIBRATO_SAMPLE_INCREMENTS)))
		* (double)(depth) * VIBRATO_AMPLITUDE_TUNING);

	a *= pow(2.0, pb / (8192 * 12.f));

	/* If the sweep's over, we can store the newly computed sample_increment */
	if (!vp->vibrato_sweep)
		vp->vibrato_sample_increment[phase] = (int) a;

	if (sign)
		a = -a; /* need to preserve the loop direction */

	return (int) a;
}